

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::base::SetLogger(LogSeverity severity,Logger *logger)

{
  undefined8 in_RAX;
  LogDestination *this;
  
  std::mutex::lock((mutex *)log_mutex);
  this = LogDestination::log_destination((LogSeverity)((ulong)in_RAX >> 0x20));
  LogDestination::SetLoggerImpl(this,logger);
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

void base::SetLogger(LogSeverity severity, base::Logger* logger) {
  std::lock_guard<std::mutex> l{log_mutex};
  LogDestination::log_destination(severity)->SetLoggerImpl(logger);
}